

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

float __thiscall
anon_unknown.dwarf_580a1::MapDriver::scanObstacleMap
          (MapDriver *this,Vec3 *start,Vec3 *center,float arcAngle,int segments,
          float endRadiusChange,Color *beforeColor,Color *afterColor,Vec3 *returnObstaclePosition)

{
  Vec3 VVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_a0;
  Vec3 local_98;
  Vec3 local_88;
  Vec3 local_78;
  float local_68;
  float local_64;
  float cos;
  float sin;
  Vec3 local_58;
  Color *local_48;
  Color *local_40;
  Vec3 *local_38;
  
  local_48 = beforeColor;
  local_40 = afterColor;
  local_38 = center;
  local_78 = OpenSteer::Vec3::operator-(start,center);
  fVar4 = (float)segments;
  OpenSteer::Vec3::operator=(returnObstaclePosition,&OpenSteer::Vec3::zero);
  fVar5 = 0.0;
  if ((endRadiusChange != 0.0) || (NAN(endRadiusChange))) {
    fVar5 = OpenSteer::Vec3::length(&local_78);
  }
  sin = 0.0;
  cos = 0.0;
  local_88.z = start->z;
  local_88.x = start->x;
  local_88.y = start->y;
  fVar6 = fVar5 + endRadiusChange;
  if (fVar5 + endRadiusChange <= 0.0) {
    fVar6 = 0.0;
  }
  local_68 = fVar6 / fVar5 + -1.0;
  bVar2 = false;
  if (segments < 1) {
    segments = 0;
  }
  local_a0 = 0.0;
  for (iVar3 = 1; iVar3 - segments != 1; iVar3 = iVar3 + 1) {
    local_78 = OpenSteer::Vec3::rotateAboutGlobalY(&local_78,arcAngle / fVar4,&sin,&cos);
    fVar5 = 1.0;
    if ((endRadiusChange != 0.0) || (NAN(endRadiusChange))) {
      fVar5 = ((float)iVar3 / fVar4) * local_68 + 1.0;
    }
    local_58.z = local_78.z * fVar5;
    local_58.x = fVar5 * local_78.x;
    local_58.y = fVar5 * local_78.y;
    local_98 = OpenSteer::Vec3::operator+(local_38,&local_58);
    if (bVar2 == false) {
      local_58.x = local_98.x - local_88.x;
      local_58.y = local_98.y - local_88.y;
      local_58.z = local_98.z - local_88.z;
      local_64 = OpenSteer::Vec3::length(&local_58);
      bVar2 = TerrainMap::getMapValue(this->map,&local_98);
      VVar1 = local_98;
      if (bVar2) {
        local_a0 = (float)iVar3 * (local_64 + local_64) * 0.5;
        returnObstaclePosition->x = local_98.x;
        returnObstaclePosition->y = local_98.y;
        local_98.z = VVar1.z;
        returnObstaclePosition->z = local_98.z;
      }
      local_98 = VVar1;
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_88,&local_98,local_48);
    }
    else {
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_88,&local_98,local_40);
      bVar2 = true;
    }
    VVar1 = local_98;
    local_88.x = local_98.x;
    local_88.y = local_98.y;
    local_98.z = VVar1.z;
    local_88.z = local_98.z;
    local_98 = VVar1;
  }
  return local_a0;
}

Assistant:

float scanObstacleMap (const Vec3& start,
                               const Vec3& center,
                               const float arcAngle,
                               const int segments,
                               const float endRadiusChange,
                               const Color& beforeColor,
                               const Color& afterColor,
                               Vec3& returnObstaclePosition)
        {
            // "spoke" is initially the vector from center to start,
            // which is then rotated step by step around center
            Vec3 spoke = start - center;
            // determine the angular step per segment
            const float step = arcAngle / segments;
            // store distance to, and position of first obstacle
            float obstacleDistance = 0;
            returnObstaclePosition = Vec3::zero;
            // for spiral "ramps" of changing radius
            const float startRadius = (endRadiusChange == 0) ? 0 : spoke.length(); 

            // traverse each segment along arc
            float sin=0, cos=0;
            Vec3 oldPoint = start;
            bool obstacleFound = false;
            for (int i = 0; i < segments; i++)
            {
                // rotate "spoke" to next step around circle
                // (sin and cos values get filled in on first call)
                spoke = spoke.rotateAboutGlobalY (step, sin, cos);

                // for spiral "ramps" of changing radius
                const float adjust = ((endRadiusChange == 0) ?
                                      1.0f :
                                      interpolate ((float)(i+1) / (float)segments,
                                                   1.0f,
                                                   (maxXXX (0,
                                                            (startRadius +
                                                             endRadiusChange))
                                                    / startRadius)));

                // construct new scan point: center point, offset by rotated
                // spoke (possibly adjusting the radius if endRadiusChange!=0)
                const Vec3 newPoint = center + (spoke * adjust);

                // once an obstacle if found "our work here is done" -- continue
                // to loop only for the sake of annotation (make that optional?)
                if (obstacleFound)
                {
                    annotationLine (oldPoint, newPoint, afterColor);
                }
                else
                {
                    // no obstacle found on this scan so far,
                    // scan map along current segment (a chord of the arc)
                    const Vec3 offset = newPoint - oldPoint;
                    const float d2 = offset.length() * 2;

                    // when obstacle found: set flag, save distance and position
                    if (! map->isPassable (newPoint))
                    {
                        obstacleFound = true;
                        obstacleDistance = d2 * 0.5f * (i+1);
                        returnObstaclePosition = newPoint;
                    }
                    annotationLine (oldPoint, newPoint, beforeColor);
                }
                // save new point for next time around loop
                oldPoint = newPoint;
            }
            // return distance to first obstacle (or zero if none found)
            return obstacleDistance;
        }